

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGenerator.cpp
# Opt level: O2

bool __thiscall SudokuGenerator::generateCell(SudokuGenerator *this,uint row,uint column)

{
  SudokuGitter *this_00;
  _Rb_tree_header *p_Var1;
  pointer __first;
  pointer __last;
  bool bVar2;
  uint uVar3;
  cell cVar4;
  ostream *poVar5;
  uint tmpRow_1;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  pointer pcVar11;
  bool bVar12;
  uint tmpRow;
  uint uVar13;
  ulong uVar14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> options;
  vector<cell,_std::allocator<cell>_> currCol;
  vector<cell,_std::allocator<cell>_> currRow;
  vector<cell,_std::allocator<cell>_> quad;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_28a8;
  vector<cell,_std::allocator<cell>_> ziffern;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_2858;
  _Vector_base<cell,_std::allocator<cell>_> local_2840;
  _Vector_base<cell,_std::allocator<cell>_> local_2828;
  _Vector_base<cell,_std::allocator<cell>_> local_2810;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_27f8;
  string local_27c0;
  string local_27a0;
  string local_2780;
  string local_2760;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  uVar10 = (ulong)column;
  std::vector<cell,_std::allocator<cell>_>::vector
            (&ziffern,(ulong)(this->gitter).elements,(allocator_type *)&local_2740);
  uVar14 = 0;
  while (uVar14 < (this->gitter).elements) {
    ziffern.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data._M_start
    [uVar14].value = (uint)(uVar14 + 1);
    ziffern.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data._M_start
    [uVar14].isStatic = false;
    uVar14 = uVar14 + 1;
  }
  std::random_device::random_device(&local_13b8);
  uVar3 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_2740,(ulong)uVar3);
  std::
  shuffle<__gnu_cxx::__normal_iterator<cell*,std::vector<cell,std::allocator<cell>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            ((__normal_iterator<cell_*,_std::vector<cell,_std::allocator<cell>_>_>)
             ziffern.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<cell_*,_std::vector<cell,_std::allocator<cell>_>_>)
             ziffern.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data
             ._M_finish,&local_2740);
  std::random_device::~random_device(&local_13b8);
  std::vector<cell,_std::allocator<cell>_>::vector
            (&quad,(ulong)(this->gitter).elements,(allocator_type *)&local_2740);
  std::vector<cell,_std::allocator<cell>_>::vector
            (&currRow,(ulong)(this->gitter).elements,(allocator_type *)&local_2740);
  std::vector<cell,_std::allocator<cell>_>::vector
            (&currCol,(ulong)(this->gitter).elements,(allocator_type *)&local_2740);
  this_00 = &this->gitter;
  std::vector<cell,_std::allocator<cell>_>::operator=
            (&currRow,(this_00->cells).
                      super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + row);
  for (uVar14 = 0; uVar14 < (this->gitter).elements; uVar14 = uVar14 + 1) {
    cVar4 = SudokuGitter::getCell(this_00,(uint)uVar14,column);
    currCol.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data._M_start
    [uVar14].value = cVar4.value;
    currCol.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data._M_start
    [uVar14].isStatic = cVar4.isStatic;
  }
  uVar3 = (this->gitter).quadWidth;
  uVar13 = (this->gitter).quadHeight;
  lVar8 = 0;
  uVar9 = column - column % uVar3;
  uVar6 = row - row % uVar13;
  for (uVar7 = uVar6; uVar7 < uVar13 + uVar6; uVar7 = uVar7 + 1) {
    lVar8 = (long)(int)lVar8;
    for (uVar13 = uVar9; uVar13 < uVar3 + uVar9; uVar13 = uVar13 + 1) {
      cVar4 = SudokuGitter::getCell(this_00,uVar7,uVar13);
      quad.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data._M_start
      [lVar8].value = cVar4.value;
      quad.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data._M_start
      [lVar8].isStatic = cVar4.isStatic;
      lVar8 = lVar8 + 1;
      uVar3 = (this->gitter).quadWidth;
    }
    uVar13 = (this->gitter).quadHeight;
  }
  local_28a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_28a8._M_impl.super__Rb_tree_header._M_header;
  local_28a8._M_impl._0_8_ = 0;
  local_28a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_28a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_28a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_28a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_28a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_28a8._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pcVar11 = currRow.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pcVar11 !=
      currRow.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
      _M_finish; pcVar11 = pcVar11 + 1) {
    local_2740._M_x[0]._0_4_ = pcVar11->value;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
    _M_insert_unique<int>(&local_28a8,(int *)&local_2740);
  }
  for (pcVar11 = currCol.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pcVar11 !=
      currCol.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
      _M_finish; pcVar11 = pcVar11 + 1) {
    local_2740._M_x[0]._0_4_ = pcVar11->value;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
    _M_insert_unique<int>(&local_28a8,(int *)&local_2740);
  }
  for (pcVar11 = quad.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pcVar11 !=
      quad.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data._M_finish
      ; pcVar11 = pcVar11 + 1) {
    local_2740._M_x[0]._0_4_ = pcVar11->value;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
    _M_insert_unique<int>(&local_28a8,(int *)&local_2740);
  }
  p_Var1 = &local_27f8._M_impl.super__Rb_tree_header;
  local_27f8._M_impl._0_8_ = 0;
  local_27f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_27f8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_27f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_27f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar3 = 1;
  local_27f8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_27f8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  for (; uVar3 <= (this->gitter).elements; uVar3 = uVar3 + 1) {
    local_2740._M_x[0]._0_4_ = uVar3;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
    _M_insert_unique<int>(&local_27f8,(int *)&local_2740);
  }
  options.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  options.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  options.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  __set_difference<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_27f8._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1,
             local_28a8._M_impl.super__Rb_tree_header._M_header._M_left,
             &local_28a8._M_impl.super__Rb_tree_header,&options,0);
  __last = options.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __first = options.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::random_device::random_device(&local_13b8);
  uVar3 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_2740,(ulong)uVar3);
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__first,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__last,&local_2740);
  std::random_device::~random_device(&local_13b8);
  uVar13 = column + 1;
  uVar7 = 0;
  uVar3 = row;
  if ((this->gitter).elements == column) {
    uVar13 = 0;
    uVar3 = row + 1;
  }
  do {
    if ((ulong)((long)options.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)options.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2) <= (ulong)uVar7) {
      lVar8 = *(long *)&(this_00->cells).
                        super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[row].
                        super__Vector_base<cell,_std::allocator<cell>_>._M_impl;
      if (*(char *)(lVar8 + 4 + uVar10 * 8) == '\x01') {
        bVar2 = generateCell(this,uVar3,uVar13);
        bVar12 = true;
        if (bVar2) break;
        lVar8 = *(long *)&(this_00->cells).
                          super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[row].
                          super__Vector_base<cell,_std::allocator<cell>_>._M_impl;
      }
      *(undefined4 *)(lVar8 + uVar10 * 8) = 0;
      *(undefined1 *)(lVar8 + 4 + uVar10 * 8) = 0;
      bVar12 = false;
      break;
    }
    uVar6 = options.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7];
    poVar5 = std::operator<<((ostream *)&std::cout,"###");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,",");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,": Versuch ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5,anon_var_dwarf_2fc02);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::vector<cell,_std::allocator<cell>_>::vector
              ((vector<cell,_std::allocator<cell>_> *)&local_2810,&currRow);
    std::__cxx11::string::string((string *)&local_2760,"Row",(allocator *)&local_2740);
    SudokuGitter::printCellVec((vector<cell,_std::allocator<cell>_> *)&local_2810,&local_2760);
    std::__cxx11::string::~string((string *)&local_2760);
    std::_Vector_base<cell,_std::allocator<cell>_>::~_Vector_base(&local_2810);
    std::vector<cell,_std::allocator<cell>_>::vector
              ((vector<cell,_std::allocator<cell>_> *)&local_2828,&currCol);
    std::__cxx11::string::string((string *)&local_2780,"Column",(allocator *)&local_2740);
    SudokuGitter::printCellVec((vector<cell,_std::allocator<cell>_> *)&local_2828,&local_2780);
    std::__cxx11::string::~string((string *)&local_2780);
    std::_Vector_base<cell,_std::allocator<cell>_>::~_Vector_base(&local_2828);
    std::vector<cell,_std::allocator<cell>_>::vector
              ((vector<cell,_std::allocator<cell>_> *)&local_2840,&quad);
    std::__cxx11::string::string((string *)&local_27a0,"Quad",(allocator *)&local_2740);
    SudokuGitter::printCellVec((vector<cell,_std::allocator<cell>_> *)&local_2840,&local_27a0);
    std::__cxx11::string::~string((string *)&local_27a0);
    std::_Vector_base<cell,_std::allocator<cell>_>::~_Vector_base(&local_2840);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2858,&options);
    std::__cxx11::string::string((string *)&local_27c0,"Options",(allocator *)&local_2740);
    SudokuGitter::printIntVec
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2858,&local_27c0);
    std::__cxx11::string::~string((string *)&local_27c0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2858);
    SudokuGitter::setCell(this_00,row,column,uVar6);
    bVar12 = true;
    if ((this->gitter).elements - 1 == column) break;
    bVar2 = generateCell(this,uVar3,uVar13);
    uVar7 = uVar7 + 1;
  } while (!bVar2);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&options.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_27f8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_28a8);
  std::_Vector_base<cell,_std::allocator<cell>_>::~_Vector_base
            (&currCol.super__Vector_base<cell,_std::allocator<cell>_>);
  std::_Vector_base<cell,_std::allocator<cell>_>::~_Vector_base
            (&currRow.super__Vector_base<cell,_std::allocator<cell>_>);
  std::_Vector_base<cell,_std::allocator<cell>_>::~_Vector_base
            (&quad.super__Vector_base<cell,_std::allocator<cell>_>);
  std::_Vector_base<cell,_std::allocator<cell>_>::~_Vector_base
            (&ziffern.super__Vector_base<cell,_std::allocator<cell>_>);
  return bVar12;
}

Assistant:

bool SudokuGenerator::generateCell(unsigned int row, unsigned int column) {
    vector<cell> ziffern(gitter.getElements());
    for (unsigned int i = 0; i < gitter.getElements(); i++)
        ziffern[i] = cell(i + 1);
    shuffle(begin(ziffern), end(ziffern), std::mt19937(std::random_device()()));

    vector<cell> quad(gitter.getElements());
    vector<cell> currRow(gitter.getElements());
    vector<cell> currCol(gitter.getElements());

    // Row Werte merken
    currRow = gitter.cells[row];
    // Column Werte merken
    for (unsigned int tmpRow = 0; tmpRow < gitter.getElements(); tmpRow++) {
        currCol[tmpRow] = gitter.getCell(tmpRow, column);
    }

    // Quad Werte merken
    auto quadStartRow = (row / gitter.getQuadHeight()) * gitter.getQuadHeight();
    auto quadStartCol = (column / gitter.getQuadWidth()) * gitter.getQuadWidth();

    int indexQuad = 0;
    for (auto tmpRow = quadStartRow; tmpRow < quadStartRow + gitter.getQuadHeight(); tmpRow++) {
        for (auto tmpCol = quadStartCol; tmpCol < quadStartCol + gitter.getQuadWidth(); tmpCol++) {
            quad[indexQuad] = gitter.getCell(tmpRow, tmpCol);
            indexQuad++;
        }
    }

    set<int> neighbours = {};

    for (auto val : currRow) {
        neighbours.insert(val.value);
    }
    for (auto val : currCol) {
        neighbours.insert(val.value);
    }
    for (auto val : quad) {
        neighbours.insert(val.value);
    }

    set<int> values = {};

    for (unsigned int i = 1; i <= gitter.getElements(); i++)
        values.insert(i);

    vector<unsigned int> options;
    set_difference(values.begin(), values.end(), neighbours.begin(), neighbours.end(),
                   inserter(options, options.begin()));

    shuffle(begin(options), end(options), std::mt19937(std::random_device()()));

    unsigned int nextRow = row;
    unsigned int nextCol = column + 1;
    if (column == gitter.getElements()) {
        nextCol = 0;
        nextRow++;
    }

    for (unsigned int i = 0; i < options.size(); i++) {
        auto tmp = static_cast<unsigned int>(options[i]);

        std::cout << "###" << row + 1 << "," << column + 1 << ": Versuch " << tmp << " einzufügen. Umgebung: "
                  << std::endl;
        SudokuGitter::printCellVec(currRow, "Row");
        SudokuGitter::printCellVec(currCol, "Column");
        SudokuGitter::printCellVec(quad, "Quad");
        SudokuGitter::printIntVec(options, "Options");


        //gitter.cells[row][column] = cell(tmp);
        gitter.setCell(row, column, tmp);

        if ((column == gitter.getElements() - 1) || generateCell(nextRow, nextCol)) {
            return true;
        }
    }

    // Wenn feste variable gehe immer weiter da ist nix zu tun
    if (gitter.cells[row][column].isStatic && generateCell(nextRow, nextCol)) {
        return true;
    }

    // Fehler. Keine Option vorhanden um die Zelle zu setzen
    gitter.cells[row][column] = cell(0);
    return false;
}